

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusNonStationary.cpp
# Opt level: O0

void __thiscall
PerseusNonStationary::InitializeBeliefs(PerseusNonStationary *this,int nrB,bool uniquify)

{
  Arguments *in_RDI;
  Arguments args;
  AlphaVectorPlanning *this_00;
  BeliefSetNonStationary *in_stack_fffffffffffffd98;
  PerseusNonStationary *in_stack_fffffffffffffda0;
  Arguments *in_stack_fffffffffffffdc0;
  
  this_00 = (AlphaVectorPlanning *)&stack0xfffffffffffffdb8;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffffdc0);
  AlphaVectorPlanning::SampleBeliefsNonStationary(this_00,in_RDI);
  SetBeliefSet(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  BeliefSetNonStationary::~BeliefSetNonStationary
            ((BeliefSetNonStationary *)in_stack_fffffffffffffda0);
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x95bca2);
  return;
}

Assistant:

void PerseusNonStationary::InitializeBeliefs(int nrB, bool uniquify)
{
    ArgumentHandlers::Arguments args;
    args.nrBeliefs=nrB;
    args.uniqueBeliefs=uniquify;
    SetBeliefSet(SampleBeliefsNonStationary(args));
}